

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFactoryRegistry.cpp
# Opt level: O2

AbstractFactory * __thiscall
tcu::GenericFactoryRegistry::getFactoryByName(GenericFactoryRegistry *this,string *name)

{
  pointer ppAVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t index;
  ulong uVar4;
  
  uVar4 = 0;
  while( true ) {
    ppAVar1 = (this->m_factories).
              super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_factories).
                      super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar1 >> 3) <= uVar4) {
      return (AbstractFactory *)0x0;
    }
    iVar3 = (*ppAVar1[uVar4]->_vptr_AbstractFactory[2])();
    bVar2 = std::operator==(name,(char *)CONCAT44(extraout_var,iVar3));
    if (bVar2) break;
    uVar4 = uVar4 + 1;
  }
  return (this->m_factories).
         super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>._M_impl
         .super__Vector_impl_data._M_start[uVar4];
}

Assistant:

const AbstractFactory* GenericFactoryRegistry::getFactoryByName (const std::string& name) const
{
	for (size_t index = 0; index < m_factories.size(); index++)
	{
		if (name == m_factories[index]->getName())
			return m_factories[index];
	}

	return DE_NULL;
}